

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmuni.h
# Opt level: O0

int CVmCaseFoldStr::wstreq(wchar_t *a,wchar_t *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t cb;
  wchar_t ca;
  CVmCaseFoldStr fb;
  CVmCaseFoldStr fa;
  CVmCaseFoldStr *in_stack_ffffffffffffff98;
  CVmCaseFoldStr *in_stack_ffffffffffffffa0;
  
  CVmCaseFoldStr(in_stack_ffffffffffffffa0,(wchar_t *)in_stack_ffffffffffffff98);
  CVmCaseFoldStr(in_stack_ffffffffffffffa0,(wchar_t *)in_stack_ffffffffffffff98);
  do {
    wVar1 = getch(in_stack_ffffffffffffff98);
    wVar2 = getch(in_stack_ffffffffffffff98);
    if (wVar1 != wVar2) {
      return 0;
    }
  } while (wVar1 != L'\0');
  return 1;
}

Assistant:

static int wstreq(const wchar_t *a, const wchar_t *b)
    {
        /* loop over characters until we find a mismatch */
        for (CVmCaseFoldStr fa(a), fb(b) ; ; )
        {
            /* get the next character of each folded string */
            wchar_t ca = fa.getch();
            wchar_t cb = fb.getch();
            
            /* if they differ, return not equal */
            if (ca != cb)
                return FALSE;
            
            /* if they both ended here, we have a match */
            if (ca == 0)
                return TRUE;
        }
    }